

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

int cs_impl::conio::kbhit(void)

{
  ulong uVar1;
  int ret;
  fd_set *__arr;
  uint __i;
  timeval tv;
  fd_set fds;
  uint local_94;
  timeval local_90;
  ulong local_80 [10];
  int in_stack_ffffffffffffffd4;
  
  terminal_lnbuf(in_stack_ffffffffffffffd4);
  terminal_echo(in_stack_ffffffffffffffd4);
  local_90.tv_sec = 0;
  local_90.tv_usec = 0;
  for (local_94 = 0; local_94 < 0x10; local_94 = local_94 + 1) {
    local_80[local_94] = 0;
  }
  local_80[0] = local_80[0] | 1;
  select(1,(fd_set *)local_80,(fd_set *)0x0,(fd_set *)0x0,&local_90);
  uVar1 = local_80[0] & 1;
  terminal_lnbuf(in_stack_ffffffffffffffd4);
  terminal_echo(in_stack_ffffffffffffffd4);
  return (uint)(uVar1 != 0);
}

Assistant:

int kbhit()
		{
			fd_set fds;
			terminal_lnbuf(0);
			terminal_echo(0);
			struct timeval tv;
			tv.tv_sec = 0;
			tv.tv_usec = 0;
			FD_ZERO(&fds);
			FD_SET(0, &fds);
			select(1, &fds, 0, 0, &tv);
			int ret = FD_ISSET(0, &fds);
			terminal_lnbuf(1);
			terminal_echo(1);
			return ret;
		}